

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O1

bool crnlib::string_to_uint(char **pBuf,uint *value)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  uint uVar6;
  char *pcVar7;
  
  *value = 0;
  pcVar7 = *pBuf;
  cVar5 = *pcVar7;
  while ((cVar5 != '\0' && (iVar2 = isspace((int)cVar5), iVar2 != 0))) {
    cVar5 = pcVar7[1];
    pcVar7 = pcVar7 + 1;
  }
  if ((int)cVar5 - 0x30U < 10) {
    uVar3 = 0;
    do {
      if ((*pcVar7 == '\0') || (uVar4 = (int)*pcVar7 - 0x30, 9 < uVar4)) {
        *value = uVar3;
        *pBuf = pcVar7;
        return true;
      }
      if (0x1fffffff < uVar3) {
        return false;
      }
      if (CARRY4(uVar3 * 8,uVar3 * 2)) {
        bVar1 = false;
      }
      else {
        uVar6 = ~(uVar3 * 10);
        bVar1 = uVar4 <= uVar6;
        if (uVar6 < uVar4) {
          uVar4 = 0;
        }
        uVar3 = uVar4 + uVar3 * 10;
        pcVar7 = pcVar7 + bVar1;
      }
    } while (bVar1);
  }
  return false;
}

Assistant:

bool string_to_uint(const char*& pBuf, uint& value) {
  value = 0;

  CRNLIB_ASSERT(pBuf);
  const char* p = pBuf;

  while (*p && isspace(*p))
    p++;

  uint result = 0;

  if (!isdigit(*p))
    return false;

  while (*p && isdigit(*p)) {
    if (result & 0xE0000000U)
      return false;

    const uint result8 = result << 3U;
    const uint result2 = result << 1U;

    if (result2 > (0xFFFFFFFFU - result8))
      return false;

    result = result8 + result2;

    uint c = p[0] - '0';
    if (c > (0xFFFFFFFFU - result))
      return false;

    result += c;

    p++;
  }

  value = result;

  pBuf = p;

  return true;
}